

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

void __thiscall Fl_Browser::item_draw(Fl_Browser *this,void *item,int X,int Y,int W,int H)

{
  byte bVar1;
  uint uVar2;
  int iVar4;
  Fl_Align align;
  char *pcVar5;
  void *pvVar6;
  int iVar7;
  Fl_Color fg;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  bool bVar12;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  byte *local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  char *local_90;
  ulong local_88;
  uint local_7c;
  ulong local_78;
  uint *local_70;
  void *local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  uint uVar3;
  
  local_78 = CONCAT44(in_register_00000014,X);
  local_50 = CONCAT44(in_register_0000000c,Y);
  local_48 = (ulong)(uint)H;
  pbVar14 = (byte *)((long)item + 0x23);
  local_70 = (uint *)this->column_widths_;
  local_60 = Y + 1;
  local_54 = Y + -1 + H;
  local_58 = H / 2 + Y + 1;
  local_5c = H / 2 + Y;
  bVar12 = true;
  local_68 = item;
  do {
    if (W < 7) {
      return;
    }
    local_a8 = pbVar14;
    if ((*local_70 == 0) ||
       (local_90 = strchr((char *)pbVar14,(int)this->column_char_), local_90 == (char *)0x0)) {
      local_90 = (char *)0x0;
      uVar13 = W;
    }
    else {
      *local_90 = '\0';
      uVar13 = *local_70;
      local_70 = local_70 + 1;
    }
    pvVar6 = local_68;
    if ((bVar12) && (*(Fl_Image **)((long)local_68 + 0x18) != (Fl_Image *)0x0)) {
      iVar4 = (int)local_78;
      Fl_Image::draw(*(Fl_Image **)((long)local_68 + 0x18),iVar4 + 2,local_60);
      iVar7 = *(int *)(*(long *)((long)pvVar6 + 0x18) + 8);
      local_38 = (ulong)(iVar7 + iVar4 + 2);
      iVar7 = iVar7 + 2;
      local_9c = W - iVar7;
      uVar13 = uVar13 - iVar7;
    }
    else {
      local_38 = local_78 & 0xffffffff;
      local_9c = W;
    }
    local_40 = (ulong)uVar13;
    uVar10 = (ulong)(uint)(this->super_Fl_Browser_).textfont_;
    uVar15 = (ulong)(uint)(this->super_Fl_Browser_).textsize_;
    local_88 = (ulong)(this->super_Fl_Browser_).textcolor_;
    iVar7 = (int)local_38;
    local_94 = iVar7 + 3;
    local_78 = (ulong)(iVar7 + uVar13);
    local_7c = iVar7 + -3 + uVar13;
    local_98 = 4;
    while( true ) {
      if (*pbVar14 != this->format_char_) break;
      pbVar9 = pbVar14 + 1;
      bVar1 = pbVar14[1];
      local_a8 = pbVar9;
      if ((bVar1 == 0) || (bVar1 == *pbVar14)) {
switchD_001a5f18_caseD_40:
        pbVar14 = pbVar14 + 1;
        break;
      }
      local_a8 = pbVar14 + 2;
      switch(bVar1) {
      case 0x5f:
      case 0x75:
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,local_88);
        pp_Var11 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
        uVar13 = local_7c;
        uVar2 = local_54;
        uVar3 = local_94;
LAB_001a607c:
        (*pp_Var11[0xc])(fl_graphics_driver,(ulong)uVar3,(ulong)uVar2,(ulong)uVar13,(ulong)uVar2);
        break;
      case 0x60:
      case 0x61:
      case 100:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
        break;
      case 0x62:
        uVar10 = (ulong)((uint)uVar10 | 1);
        break;
      case 99:
        local_98 = 0;
        break;
      case 0x66:
      case 0x74:
        uVar10 = 4;
        break;
      case 0x69:
        uVar10 = (ulong)((uint)uVar10 | 2);
        break;
      case 0x6c:
switchD_001a5ecd_caseD_6c:
        uVar15 = 0x18;
        break;
      case 0x6d:
switchD_001a5ecd_caseD_6d:
        uVar15 = 0x12;
        break;
      case 0x72:
        local_98 = 8;
        break;
      case 0x73:
        uVar15 = 0xb;
        break;
      default:
        switch(bVar1) {
        case 0x40:
          goto switchD_001a5f18_caseD_40;
        case 0x41:
        case 0x44:
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4f:
        case 0x50:
        case 0x51:
        case 0x52:
          break;
        case 0x42:
          if ((*(byte *)((long)local_68 + 0x22) & 1) == 0) {
            uVar8 = strtol((char *)local_a8,(char **)&local_a8,10);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,uVar8 & 0xffffffff);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                      (fl_graphics_driver,local_38,local_50,local_40,local_48);
          }
          else {
            do {
              pbVar14 = pbVar9 + 1;
              pbVar9 = pbVar9 + 1;
              local_a8 = pbVar9;
            } while (*pbVar14 - 0x30 < 10);
          }
          break;
        case 0x43:
          local_88 = strtol((char *)local_a8,(char **)&local_a8,10);
          break;
        case 0x46:
          uVar10 = strtol((char *)local_a8,(char **)&local_a8,10);
          break;
        case 0x4c:
          goto switchD_001a5ecd_caseD_6c;
        case 0x4d:
          goto switchD_001a5ecd_caseD_6d;
        case 0x4e:
          local_88 = 8;
          break;
        case 0x53:
          uVar15 = strtol((char *)local_a8,(char **)&local_a8,10);
          break;
        default:
          if (bVar1 == 0x2d) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
            uVar13 = local_7c;
            uVar3 = local_94;
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)local_94,(ulong)local_5c,(ulong)local_7c,
                       (ulong)local_5c);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x36);
            pp_Var11 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
            uVar2 = local_58;
            goto LAB_001a607c;
          }
          pbVar14 = local_a8;
          if (bVar1 == 0x2e) goto LAB_001a6091;
        }
      }
      pbVar14 = local_a8;
    }
LAB_001a6091:
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,uVar10 & 0xffffffff,uVar15 & 0xffffffff);
    fg = (Fl_Color)local_88;
    if ((*(byte *)((long)local_68 + 0x22) & 1) != 0) {
      fg = fl_contrast(fg,(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.color2_);
    }
    uVar13 = local_9c;
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar7 == 0) {
      fg = fl_inactive(fg);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)fg);
    pcVar5 = local_90;
    iVar7 = (int)local_40;
    align = local_98 | 0x40;
    if (local_90 == (char *)0x0) {
      align = local_98;
    }
    fl_draw((char *)pbVar14,local_94,(int)local_50,iVar7 + -6,(int)local_48,align,(Fl_Image *)0x0,0)
    ;
    if (pcVar5 == (char *)0x0) {
      return;
    }
    *local_90 = this->column_char_;
    W = uVar13 - iVar7;
    pbVar14 = (byte *)(local_90 + 1);
    bVar12 = false;
  } while( true );
}

Assistant:

void Fl_Browser::item_draw(void* item, int X, int Y, int W, int H) const {
  FL_BLINE* l = (FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();

  bool first = true;	// for icon
  while (W > 6) {	// do each tab-separated field
    int w1 = W;	// width for this field
    char* e = 0; // pointer to end of field or null if none
    if (*i) { // find end of field and temporarily replace with 0
      e = strchr(str, column_char());
      if (e) {*e = 0; w1 = *i++;}
    }
    // Icon drawing code
    if (first) {
      first = false;
      if (l->icon) {
	l->icon->draw(X+2,Y+1);	// leave 2px left, 1px above
	int iconw = l->icon->w()+2;
	X += iconw; W -= iconw; w1 -= iconw;
      }
    }
    int tsize = textsize();
    Fl_Font font = textfont();
    Fl_Color lcol = textcolor();
    Fl_Align talign = FL_ALIGN_LEFT;
    // check for all the @-lines recognized by XForms:
    //#if defined(__GNUC__)
    //#warning FIXME This maybe needs to be more UTF8 aware now...?
    //#endif /*__GNUC__*/
    while (*str == format_char() && *++str && *str != format_char()) {
      switch (*str++) {
      case 'l': case 'L': tsize = 24; break;
      case 'm': case 'M': tsize = 18; break;
      case 's': tsize = 11; break;
      case 'b': font = (Fl_Font)(font|FL_BOLD); break;
      case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
      case 'f': case 't': font = FL_COURIER; break;
      case 'c': talign = FL_ALIGN_CENTER; break;
      case 'r': talign = FL_ALIGN_RIGHT; break;
      case 'B': 
	if (!(l->flags & SELECTED)) {
	  fl_color((Fl_Color)strtol(str, &str, 10));
	  fl_rectf(X, Y, w1, H);
	} else while (isdigit(*str & 255)) str++; // skip digits
        break;
      case 'C':
	lcol = (Fl_Color)strtol(str, &str, 10);
	break;
      case 'F':
	font = (Fl_Font)strtol(str, &str, 10);
	break;
      case 'N':
	lcol = FL_INACTIVE_COLOR;
	break;
      case 'S':
	tsize = strtol(str, &str, 10);
	break;
      case '-':
	fl_color(FL_DARK3);
	fl_line(X+3, Y+H/2, X+w1-3, Y+H/2);
	fl_color(FL_LIGHT3);
	fl_line(X+3, Y+H/2+1, X+w1-3, Y+H/2+1);
	break;
      case 'u':
      case '_':
	fl_color(lcol);
	fl_line(X+3, Y+H-1, X+w1-3, Y+H-1);
	break;
      case '.':
	goto BREAK;
      case '@':
	str--; goto BREAK;
      }
    }
  BREAK:
    fl_font(font, tsize);
    if (l->flags & SELECTED)
      lcol = fl_contrast(lcol, selection_color());
    if (!active_r()) lcol = fl_inactive(lcol);
    fl_color(lcol);
    fl_draw(str, X+3, Y, w1-6, H, e ? Fl_Align(talign|FL_ALIGN_CLIP) : talign, 0, 0);
    if (!e) break; // no more fields...
    *e = column_char(); // put the separator back
    X += w1;
    W -= w1;
    str = e+1;
  }
}